

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O1

void __thiscall
CoreML::NeuralNetworkShaper::shapeReduceLayer
          (NeuralNetworkShaper *this,NeuralNetworkLayer *specLayer)

{
  LogMessage *pLVar1;
  mapped_type *this_00;
  mapped_type *this_01;
  ShapeRange *pSVar2;
  ShapeRange *pSVar3;
  LayerUnion from;
  runtime_error *this_02;
  ReduceLayerParams reduce;
  ShapeRange SStack_118;
  ReduceLayerParams local_f8;
  LogMessage local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  
  if ((specLayer->input_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar1 = google::protobuf::internal::LogMessage::operator<<
                       (&local_a0,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_d8,pLVar1);
    google::protobuf::internal::LogMessage::~LogMessage(&local_a0);
  }
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](&this->blobShapes,
                         (key_type *)
                         ((specLayer->input_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar1 = google::protobuf::internal::LogMessage::operator<<
                       (&local_68,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_d8,pLVar1);
    google::protobuf::internal::LogMessage::~LogMessage(&local_68);
  }
  this_01 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](&this->blobShapes,
                         (key_type *)
                         ((specLayer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_d8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar1 = google::protobuf::internal::LogMessage::operator<<
                       (&local_d8,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_f8,pLVar1);
    google::protobuf::internal::LogMessage::~LogMessage(&local_d8);
  }
  ShapeConstraint::setName
            (this_01,(string *)((specLayer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  pSVar2 = ShapeConstraint::sequenceRange(this_01);
  pSVar3 = ShapeConstraint::sequenceRange(this_00);
  ShapeRange::intersect((ShapeRange *)&local_f8,pSVar2,pSVar3);
  ShapeConstraint::updateSequenceRange(this_01,(ShapeRange *)&local_f8);
  pSVar2 = ShapeConstraint::batchRange(this_01);
  pSVar3 = ShapeConstraint::batchRange(this_00);
  ShapeRange::intersect((ShapeRange *)&local_f8,pSVar2,pSVar3);
  ShapeConstraint::updateBatchRange(this_01,(ShapeRange *)&local_f8);
  pSVar2 = ShapeConstraint::sequenceRange(this_01);
  ShapeConstraint::updateSequenceRange(this_00,pSVar2);
  pSVar2 = ShapeConstraint::batchRange(this_01);
  ShapeConstraint::updateBatchRange(this_00,pSVar2);
  if (specLayer->_oneof_case_[0] == 0x118) {
    from = specLayer->layer_;
  }
  else {
    from.reduce_ = Specification::ReduceLayerParams::default_instance();
  }
  Specification::ReduceLayerParams::ReduceLayerParams(&local_f8,from.reduce_);
  switch(local_f8.axis_) {
  case 0:
    ShapeConstraint::setChannel(this_01,1);
    break;
  case 1:
    pSVar2 = ShapeConstraint::channelRange(this_01);
    pSVar3 = ShapeConstraint::channelRange(this_00);
    ShapeRange::intersect(&SStack_118,pSVar2,pSVar3);
    ShapeConstraint::updateChannelRange(this_01,&SStack_118);
    pSVar2 = ShapeConstraint::channelRange(this_01);
    ShapeConstraint::updateChannelRange(this_00,pSVar2);
    break;
  case 2:
    ShapeConstraint::setChannel(this_01,1);
    pSVar2 = ShapeConstraint::heightRange(this_01);
    pSVar3 = ShapeConstraint::heightRange(this_00);
    ShapeRange::intersect(&SStack_118,pSVar2,pSVar3);
    ShapeConstraint::updateHeightRange(this_01,&SStack_118);
    pSVar2 = ShapeConstraint::heightRange(this_01);
    ShapeConstraint::updateHeightRange(this_00,pSVar2);
    pSVar2 = ShapeConstraint::widthRange(this_01);
    pSVar3 = ShapeConstraint::widthRange(this_00);
    ShapeRange::intersect(&SStack_118,pSVar2,pSVar3);
    ShapeConstraint::updateWidthRange(this_01,&SStack_118);
    pSVar2 = ShapeConstraint::widthRange(this_01);
    goto LAB_00280eed;
  case 3:
    pSVar2 = ShapeConstraint::channelRange(this_01);
    pSVar3 = ShapeConstraint::channelRange(this_00);
    ShapeRange::intersect(&SStack_118,pSVar2,pSVar3);
    ShapeConstraint::updateChannelRange(this_01,&SStack_118);
    pSVar2 = ShapeConstraint::channelRange(this_01);
    ShapeConstraint::updateChannelRange(this_00,pSVar2);
    ShapeConstraint::setHeight(this_01,1);
    pSVar2 = ShapeConstraint::widthRange(this_01);
    pSVar3 = ShapeConstraint::widthRange(this_00);
    ShapeRange::intersect(&SStack_118,pSVar2,pSVar3);
    ShapeConstraint::updateWidthRange(this_01,&SStack_118);
    pSVar2 = ShapeConstraint::widthRange(this_01);
    this_01 = this_00;
LAB_00280eed:
    ShapeConstraint::updateWidthRange(this_01,pSVar2);
    goto LAB_00280f53;
  case 4:
    pSVar2 = ShapeConstraint::channelRange(this_01);
    pSVar3 = ShapeConstraint::channelRange(this_00);
    ShapeRange::intersect(&SStack_118,pSVar2,pSVar3);
    ShapeConstraint::updateChannelRange(this_01,&SStack_118);
    pSVar2 = ShapeConstraint::channelRange(this_01);
    ShapeConstraint::updateChannelRange(this_00,pSVar2);
    pSVar2 = ShapeConstraint::heightRange(this_01);
    pSVar3 = ShapeConstraint::heightRange(this_00);
    ShapeRange::intersect(&SStack_118,pSVar2,pSVar3);
    ShapeConstraint::updateHeightRange(this_01,&SStack_118);
    pSVar2 = ShapeConstraint::heightRange(this_01);
    ShapeConstraint::updateHeightRange(this_00,pSVar2);
    goto LAB_00280f46;
  default:
    if (local_f8.axis_ == 0x7fffffff) {
      this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_02,"Reduce layer axis not set -- should have been caught in validator.");
      __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    goto LAB_00280f53;
  }
  ShapeConstraint::setHeight(this_01,1);
LAB_00280f46:
  ShapeConstraint::setWidth(this_01,1);
LAB_00280f53:
  Specification::ReduceLayerParams::~ReduceLayerParams(&local_f8);
  return;
}

Assistant:

void NeuralNetworkShaper::shapeReduceLayer(const Specification::NeuralNetworkLayer& specLayer) {

    //get the input shape
    ShapeConstraint& inputShape = blobShapes[specLayer.input(0)];
    ShapeConstraint& outputShape = blobShapes[specLayer.output(0)];
    outputShape.setName(specLayer.output(0));

    outputShape.updateSequenceRange(outputShape.sequenceRange().intersect(inputShape.sequenceRange()));
    outputShape.updateBatchRange(outputShape.batchRange().intersect(inputShape.batchRange()));

    inputShape.updateSequenceRange(outputShape.sequenceRange());
    inputShape.updateBatchRange(outputShape.batchRange());

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Reduce layer " << specLayer.name() << " input shapes (before): " << std::endl;
    std::cout << inputShape;
    std::cout << "Reduce layer " << specLayer.name() << " output shapes (before): " << std::endl;
    std::cout << outputShape;
#endif

    Specification::ReduceLayerParams reduce = specLayer.reduce();

    switch (reduce.axis()) {
        case Specification::ReduceLayerParams::CHW: {
            outputShape.setChannel(1);
            outputShape.setHeight(1);
            outputShape.setWidth(1);
            break;
        }
        case Specification::ReduceLayerParams::HW: {
            outputShape.updateChannelRange(outputShape.channelRange().intersect(inputShape.channelRange()));
            inputShape.updateChannelRange(outputShape.channelRange());
            outputShape.setHeight(1);
            outputShape.setWidth(1);
            break;
        }
        case Specification::ReduceLayerParams::H: {
            outputShape.updateChannelRange(outputShape.channelRange().intersect(inputShape.channelRange()));
            inputShape.updateChannelRange(outputShape.channelRange());
            outputShape.setHeight(1);
            outputShape.updateWidthRange(outputShape.widthRange().intersect(inputShape.widthRange()));
            inputShape.updateWidthRange(outputShape.widthRange());
            break;
        }
        case Specification::ReduceLayerParams::W: {
            outputShape.updateChannelRange(outputShape.channelRange().intersect(inputShape.channelRange()));
            inputShape.updateChannelRange(outputShape.channelRange());
            outputShape.updateHeightRange(outputShape.heightRange().intersect(inputShape.heightRange()));
            inputShape.updateHeightRange(outputShape.heightRange());
            outputShape.setWidth(1);
            break;
        }
        case Specification::ReduceLayerParams::C: {
            outputShape.setChannel(1);
            outputShape.updateHeightRange(outputShape.heightRange().intersect(inputShape.heightRange()));
            inputShape.updateHeightRange(outputShape.heightRange());
            outputShape.updateWidthRange(outputShape.widthRange().intersect(inputShape.widthRange()));
            outputShape.updateWidthRange(outputShape.widthRange());
            break;
        }
        case CoreML::Specification::ReduceLayerParams_ReduceAxis_ReduceLayerParams_ReduceAxis_INT_MIN_SENTINEL_DO_NOT_USE_:
        case CoreML::Specification::ReduceLayerParams_ReduceAxis_ReduceLayerParams_ReduceAxis_INT_MAX_SENTINEL_DO_NOT_USE_: {
            throw std::runtime_error("Reduce layer axis not set -- should have been caught in validator.");
            break;
        }
    }

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Reduce layer " << specLayer.name() << " input shapes (after): " << std::endl;
    std::cout << inputShape;
    std::cout << "Reduce layer " << specLayer.name() << " output shapes (after): " << std::endl;
    std::cout << outputShape;
#endif

}